

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O2

Sexp * __thiscall Activation::Get(Activation *this,size_t up_index,size_t right_index)

{
  pointer ppSVar1;
  Sexp *pSVar2;
  uint __line;
  JetRuntimeException *pJVar3;
  char *__assertion;
  bool bVar4;
  string local_78;
  string local_58;
  ContractFrameProtector local_38;
  ContractFrameProtector __contract_frame;
  
  ContractFrameProtector::ContractFrameProtector(&local_38,"Get");
  ContractFrame::AddContract(local_38.protected_frame,NoGc);
  do {
    bVar4 = up_index == 0;
    up_index = up_index - 1;
    if (bVar4) {
      if (this != (Activation *)0x0) {
        ppSVar1 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= right_index) {
          pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_78,
                     "invalid read of uninitialized variable. Run with --warnings for more details."
                     ,(allocator *)((long)&__contract_frame.protected_frame + 7));
          JetRuntimeException::JetRuntimeException(pJVar3,&local_78);
          __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,
                      JetRuntimeException::~JetRuntimeException);
        }
        pSVar2 = ppSVar1[right_index];
        if (pSVar2 != (Sexp *)0x0) {
          ContractFrameProtector::~ContractFrameProtector(&local_38);
          return pSVar2;
        }
        pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_58,
                   "invalid read of uninitialized variable. Run with --warnings for more details.",
                   (allocator *)((long)&__contract_frame.protected_frame + 7));
        JetRuntimeException::JetRuntimeException(pJVar3,&local_58);
        __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException)
        ;
      }
      __assertion = "cursor != nullptr";
      __line = 0x27;
LAB_00116f1f:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                    ,__line,"Sexp *Activation::Get(size_t, size_t)");
    }
    if (this == (Activation *)0x0) {
      __assertion = "cursor != nullptr";
      __line = 0x22;
      goto LAB_00116f1f;
    }
    if (this->parent->kind != ACTIVATION) {
      __assertion = "cursor->parent->IsActivation()";
      __line = 0x23;
      goto LAB_00116f1f;
    }
    this = (this->parent->field_1).activation;
  } while( true );
}

Assistant:

Sexp *Activation::Get(size_t up_index, size_t right_index) {
  CONTRACT { FORBID_GC; }